

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O3

void __thiscall CommandLineParser::readNonOptionCommands(CommandLineParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  _Alloc_hider _Var6;
  string parameters;
  CommandLinePlugInInfo plugIn;
  string local_e0;
  string local_b8;
  undefined1 local_98 [72];
  string local_50;
  
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_98 + 0x10);
  local_98._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,":","");
  bVar3 = argumentStartsWith(this,(string *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != paVar1) {
    operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
  }
  if (bVar3) {
    getNextArgument_abi_cxx11_(&local_e0,this);
    std::__cxx11::string::substr((ulong)local_98,(ulong)&local_e0);
    std::__cxx11::string::operator=((string *)&this->m_testPath,(string *)local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ != paVar1) {
      operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
      return;
    }
    lVar5 = CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,local_e0.field_2._M_local_buf[0]);
    _Var6._M_p = local_e0._M_dataplus._M_p;
    goto LAB_001058a1;
  }
  local_98._8_8_ = 0;
  local_98[0x10] = '\0';
  paVar2 = &local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  local_e0._M_dataplus._M_p = (pointer)paVar2;
  local_98._0_8_ = paVar1;
  CppUnit::PlugInParameters::PlugInParameters
            ((PlugInParameters *)(local_98 + 0x20),(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  getCurrentArgument_abi_cxx11_(&local_e0,this);
  iVar4 = std::__cxx11::string::find((char)&local_e0,0x3d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  if (iVar4 < 0) {
    getCurrentArgument_abi_cxx11_(&local_e0,this);
    std::__cxx11::string::operator=((string *)local_98,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      local_b8.field_2._M_allocated_capacity =
           CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,local_e0.field_2._M_local_buf[0]);
      local_b8._M_dataplus._M_p = local_e0._M_dataplus._M_p;
      goto LAB_00105840;
    }
  }
  else {
    getCurrentArgument_abi_cxx11_(&local_b8,this);
    std::__cxx11::string::substr((ulong)&local_e0,(ulong)&local_b8);
    std::__cxx11::string::operator=((string *)local_98,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    getCurrentArgument_abi_cxx11_(&local_e0,this);
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
    CppUnit::PlugInParameters::PlugInParameters((PlugInParameters *)&local_e0,(string *)&local_b8);
    std::__cxx11::string::_M_assign((string *)(local_98 + 0x28));
    CppUnit::PlugInParameters::~PlugInParameters((PlugInParameters *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_00105840:
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  std::deque<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>::push_back
            (&this->m_plugIns,(value_type *)local_98);
  getNextArgument_abi_cxx11_(&local_50,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  CppUnit::PlugInParameters::~PlugInParameters((PlugInParameters *)(local_98 + 0x20));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ == paVar1) {
    return;
  }
  lVar5 = CONCAT71(local_98._17_7_,local_98[0x10]);
  _Var6._M_p = (pointer)local_98._0_8_;
LAB_001058a1:
  operator_delete(_Var6._M_p,lVar5 + 1);
  return;
}

Assistant:

void 
CommandLineParser::readNonOptionCommands()
{
  if ( argumentStartsWith( ":" ) )
    m_testPath = getNextArgument().substr( 1 );
  else
  {
    CommandLinePlugInInfo plugIn;
    int indexParameter = getCurrentArgument().find( '=' );
    if ( indexParameter < 0 )
      plugIn.m_fileName = getCurrentArgument();
    else
    {
      plugIn.m_fileName = getCurrentArgument().substr( 0, indexParameter );
      std::string parameters = getCurrentArgument().substr( indexParameter +1 );
      plugIn.m_parameters = CPPUNIT_NS::PlugInParameters( parameters );
    }
    
    m_plugIns.push_back( plugIn );

    getNextArgument();
  }
}